

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<Symbol>::emplace<Symbol>
          (QMovableArrayOps<Symbol> *this,qsizetype i,Symbol *args)

{
  Symbol **ppSVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  Symbol tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.size == i) {
      qVar5 = QArrayDataPointer<Symbol>::freeSpaceAtEnd((QArrayDataPointer<Symbol> *)this);
      if (qVar5 == 0) goto LAB_0012d23d;
      Symbol::Symbol((this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.ptr +
                     (this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.size,
                     args);
LAB_0012d32c:
      pqVar2 = &(this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0012d2eb;
    }
LAB_0012d23d:
    if (i == 0) {
      qVar5 = QArrayDataPointer<Symbol>::freeSpaceAtBegin((QArrayDataPointer<Symbol> *)this);
      if (qVar5 != 0) {
        Symbol::Symbol((this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.ptr +
                       -1,args);
        ppSVar1 = &(this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.ptr;
        *ppSVar1 = *ppSVar1 + -1;
        goto LAB_0012d32c;
      }
    }
  }
  tmp.from = -0x5555555555555556;
  tmp.len = -0x5555555555555556;
  tmp.lex.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  tmp.lex.d.size = -0x5555555555555556;
  tmp.lineNum = -0x55555556;
  tmp.token = 0xaaaaaaaa;
  tmp.lex.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  Symbol::Symbol(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.size != 0;
  QArrayDataPointer<Symbol>::detachAndGrow
            ((QArrayDataPointer<Symbol> *)this,(uint)(i == 0 && bVar6),1,(Symbol **)0x0,
             (QArrayDataPointer<Symbol> *)0x0);
  if (i == 0 && bVar6) {
    Symbol::Symbol((this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.ptr + -1,
                   &tmp);
    ppSVar1 = &(this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.ptr;
    *ppSVar1 = *ppSVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<Symbol>).super_QArrayDataPointer<Symbol>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<Symbol> *)this,i,1);
    Symbol::Symbol(local_80.displaceFrom,&tmp);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&tmp.lex.d);
LAB_0012d2eb:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }